

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O0

bool __thiscall
cmComputeTargetDepends::CheckComponents(cmComputeTargetDepends *this,cmComputeComponentGraph *ccg)

{
  bool bVar1;
  TargetType TVar2;
  vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_> *this_00;
  size_type sVar3;
  size_type sVar4;
  reference piVar5;
  reference ppcVar6;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  const_iterator ni;
  NodeList *nl;
  int c;
  int nc;
  vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_> *components;
  cmComputeComponentGraph *ccg_local;
  cmComputeTargetDepends *this_local;
  
  this_00 = cmComputeComponentGraph::GetComponents(ccg);
  sVar3 = std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::size(this_00);
  nl._0_4_ = 0;
  do {
    if ((int)sVar3 <= (int)nl) {
      return true;
    }
    ni._M_current =
         (int *)std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::operator[]
                          (this_00,(long)(int)nl);
    sVar4 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)ni._M_current);
    if (1 < sVar4) {
      if ((this->NoCycles & 1U) != 0) {
        ComplainAboutBadComponent(this,ccg,(int)nl,false);
        return false;
      }
      local_40._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(ni._M_current);
      while( true ) {
        local_48._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(ni._M_current);
        bVar1 = __gnu_cxx::operator!=(&local_40,&local_48);
        if (!bVar1) break;
        piVar5 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                 ::operator*(&local_40);
        ppcVar6 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                  ::operator[](&this->Targets,(long)*piVar5);
        TVar2 = cmGeneratorTarget::GetType(*ppcVar6);
        if (TVar2 != STATIC_LIBRARY) {
          ComplainAboutBadComponent(this,ccg,(int)nl,false);
          return false;
        }
        __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
        operator++(&local_40);
      }
    }
    nl._0_4_ = (int)nl + 1;
  } while( true );
}

Assistant:

bool cmComputeTargetDepends::CheckComponents(
  cmComputeComponentGraph const& ccg)
{
  // All non-trivial components should consist only of static
  // libraries.
  std::vector<NodeList> const& components = ccg.GetComponents();
  int nc = static_cast<int>(components.size());
  for (int c = 0; c < nc; ++c) {
    // Get the current component.
    NodeList const& nl = components[c];

    // Skip trivial components.
    if (nl.size() < 2) {
      continue;
    }

    // Immediately complain if no cycles are allowed at all.
    if (this->NoCycles) {
      this->ComplainAboutBadComponent(ccg, c);
      return false;
    }

    // Make sure the component is all STATIC_LIBRARY targets.
    for (NodeList::const_iterator ni = nl.begin(); ni != nl.end(); ++ni) {
      if (this->Targets[*ni]->GetType() != cmStateEnums::STATIC_LIBRARY) {
        this->ComplainAboutBadComponent(ccg, c);
        return false;
      }
    }
  }
  return true;
}